

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::get_remote_addr_abi_cxx11_(socket_t sock)

{
  socklen_t __salen;
  int iVar1;
  pointer pvVar2;
  size_type sVar3;
  int in_ESI;
  string *in_RDI;
  array<char,_1025UL> ipstr;
  socklen_t len;
  sockaddr_storage addr;
  allocator<char> local_496;
  array<char,_1025UL> local_495;
  socklen_t local_94;
  sockaddr local_90 [9];
  
  local_94 = 0x80;
  iVar1 = getpeername(in_ESI,local_90,&local_94);
  if (iVar1 == 0) {
    memset(&local_495,0,0x401);
    __salen = local_94;
    pvVar2 = std::array<char,_1025UL>::data((array<char,_1025UL> *)0x1dc469);
    sVar3 = std::array<char,_1025UL>::size(&local_495);
    iVar1 = getnameinfo(local_90,__salen,pvVar2,(socklen_t)sVar3,(char *)0x0,0,1);
    if (iVar1 == 0) {
      pvVar2 = std::array<char,_1025UL>::data((array<char,_1025UL> *)0x1dc4ae);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,pvVar2,&local_496);
      std::allocator<char>::~allocator(&local_496);
      return in_RDI;
    }
  }
  std::__cxx11::string::string((string *)in_RDI);
  return in_RDI;
}

Assistant:

inline std::string get_remote_addr(socket_t sock) {
  struct sockaddr_storage addr;
  socklen_t len = sizeof(addr);

  if (!getpeername(sock, reinterpret_cast<struct sockaddr *>(&addr), &len)) {
    std::array<char, NI_MAXHOST> ipstr{};

    if (!getnameinfo(reinterpret_cast<struct sockaddr *>(&addr), len, ipstr.data(), ipstr.size(),
                     nullptr, 0, NI_NUMERICHOST)) {
      return ipstr.data();
    }
  }

  return std::string();
}